

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O1

PropertyAttributes __thiscall Js::PropertyDescriptor::GetAttributes(PropertyDescriptor *this)

{
  byte bVar1;
  byte bVar2;
  
  bVar2 = 0;
  if (this->enumerableSpecified != false) {
    bVar2 = this->Enumerable;
  }
  bVar2 = bVar2 | (this->Configurable & this->configurableSpecified) * '\x02';
  bVar1 = bVar2 | 4;
  if ((this->writableSpecified & this->Writable) == 0) {
    bVar1 = bVar2;
  }
  return bVar1;
}

Assistant:

PropertyAttributes PropertyDescriptor::GetAttributes() const
    {
        PropertyAttributes attributes = PropertyNone;

        if (this->configurableSpecified && this->Configurable)
        {
            attributes |= PropertyConfigurable;
        }
        if (this->enumerableSpecified && this->Enumerable)
        {
            attributes |= PropertyEnumerable;
        }
        if (this->writableSpecified && this->Writable)
        {
            attributes |= PropertyWritable;
        }

        return attributes;
    }